

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

int __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
::get_codepoint(lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
                *this)

{
  undefined4 uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0x80000000c;
  uStack_40 = 4;
  iVar4 = 0;
  lVar6 = 0;
  while( true ) {
    uVar1 = *(undefined4 *)((long)&local_48 + lVar6);
    get(this);
    iVar2 = this->current;
    iVar5 = -0x30;
    if (((iVar2 - 0x30U < 10) || (iVar5 = -0x37, iVar2 - 0x41U < 6)) ||
       (iVar5 = -0x57, iVar2 - 0x61U < 6)) {
      iVar4 = (iVar2 + iVar5 << ((byte)uVar1 & 0x1f)) + iVar4;
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    if (!bVar3) break;
    lVar6 = lVar6 + 4;
    if (lVar6 == 0x10) {
      return iVar4;
    }
  }
  return -1;
}

Assistant:

int get_codepoint()
    {
        // this function only makes sense after reading `\u`
        JSON_ASSERT(current == 'u');
        int codepoint = 0;

        const auto factors = { 12u, 8u, 4u, 0u };
        for (const auto factor : factors)
        {
            get();

            if (current >= '0' && current <= '9')
            {
                codepoint += static_cast<int>((static_cast<unsigned int>(current) - 0x30u) << factor);
            }
            else if (current >= 'A' && current <= 'F')
            {
                codepoint += static_cast<int>((static_cast<unsigned int>(current) - 0x37u) << factor);
            }
            else if (current >= 'a' && current <= 'f')
            {
                codepoint += static_cast<int>((static_cast<unsigned int>(current) - 0x57u) << factor);
            }
            else
            {
                return -1;
            }
        }

        JSON_ASSERT(0x0000 <= codepoint && codepoint <= 0xFFFF);
        return codepoint;
    }